

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSimpleBroadphase.cpp
# Opt level: O1

void __thiscall
cbtSimpleBroadphase::cbtSimpleBroadphase
          (cbtSimpleBroadphase *this,int maxProxies,cbtOverlappingPairCache *overlappingPairCache)

{
  cbtHashedOverlappingPairCache *this_00;
  cbtSimpleBroadphaseProxy *pcVar1;
  long lVar2;
  int iVar3;
  size_t size;
  
  (this->super_cbtBroadphaseInterface)._vptr_cbtBroadphaseInterface =
       (_func_int **)&PTR__cbtSimpleBroadphase_00b6f358;
  this->m_pairCache = overlappingPairCache;
  this->m_ownsPairCache = false;
  this->m_invalidPair = 0;
  if (overlappingPairCache == (cbtOverlappingPairCache *)0x0) {
    this_00 = (cbtHashedOverlappingPairCache *)cbtAlignedAllocInternal(0x78,0x10);
    cbtHashedOverlappingPairCache::cbtHashedOverlappingPairCache(this_00);
    this->m_pairCache = (cbtOverlappingPairCache *)this_00;
    this->m_ownsPairCache = true;
  }
  size = (long)maxProxies * 0x38;
  pcVar1 = (cbtSimpleBroadphaseProxy *)cbtAlignedAllocInternal(size,0x10);
  this->m_pHandlesRawPtr = pcVar1;
  if (maxProxies != 0) {
    lVar2 = 0;
    do {
      *(undefined8 *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar2 + -0x14) =
           0;
      lVar2 = lVar2 + 0x38;
    } while (size - lVar2 != 0);
  }
  this->m_pHandles = pcVar1;
  this->m_maxHandles = maxProxies;
  this->m_numHandles = 0;
  this->m_firstFreeHandle = 0;
  this->m_LastHandleIndex = -1;
  if (0 < maxProxies) {
    iVar3 = 2;
    lVar2 = 0;
    do {
      *(int *)((long)(&(pcVar1->super_cbtBroadphaseProxy).m_aabbMax + 1) + lVar2) = iVar3 + -1;
      *(int *)((long)(pcVar1->super_cbtBroadphaseProxy).m_aabbMin.m_floats + lVar2 + -4) = iVar3;
      iVar3 = iVar3 + 1;
      lVar2 = lVar2 + 0x38;
    } while ((ulong)(uint)maxProxies * 0x38 - lVar2 != 0);
  }
  *(undefined4 *)&pcVar1[(long)maxProxies + -1].super_cbtBroadphaseProxy.field_0x34 = 0;
  return;
}

Assistant:

cbtSimpleBroadphase::cbtSimpleBroadphase(int maxProxies, cbtOverlappingPairCache* overlappingPairCache)
	: m_pairCache(overlappingPairCache),
	  m_ownsPairCache(false),
	  m_invalidPair(0)
{
	if (!overlappingPairCache)
	{
		void* mem = cbtAlignedAlloc(sizeof(cbtHashedOverlappingPairCache), 16);
		m_pairCache = new (mem) cbtHashedOverlappingPairCache();
		m_ownsPairCache = true;
	}

	// allocate handles buffer and put all handles on free list
	m_pHandlesRawPtr = cbtAlignedAlloc(sizeof(cbtSimpleBroadphaseProxy) * maxProxies, 16);
	m_pHandles = new (m_pHandlesRawPtr) cbtSimpleBroadphaseProxy[maxProxies];
	m_maxHandles = maxProxies;
	m_numHandles = 0;
	m_firstFreeHandle = 0;
	m_LastHandleIndex = -1;

	{
		for (int i = m_firstFreeHandle; i < maxProxies; i++)
		{
			m_pHandles[i].SetNextFree(i + 1);
			m_pHandles[i].m_uniqueId = i + 2;  //any UID will do, we just avoid too trivial values (0,1) for debugging purposes
		}
		m_pHandles[maxProxies - 1].SetNextFree(0);
	}
}